

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_translucent(SemanticParser *this,SP *in)

{
  ParamSet *pPVar1;
  string *name;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar5;
  SP mat;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<pbrt::TranslucentMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 0x10))
  ;
  uVar2 = local_68._16_8_;
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"transmit",(allocator<char> *)local_68);
  syntactic::ParamSet::getParam3f
            (pPVar1,(float *)&(((SP *)(uVar2 + 0x30))->
                              super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  uVar2 = local_68._16_8_;
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"reflect",(allocator<char> *)local_68);
  syntactic::ParamSet::getParam3f
            (pPVar1,(float *)((long)&(((SP *)(uVar2 + 0x40))->
                                     super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + 4),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pPVar1 = (ParamSet *)*in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Kd",(allocator<char> *)local_68);
  bVar4 = syntactic::ParamSet::hasParamTexture(pPVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  uVar2 = local_68._16_8_;
  if (bVar4) {
    name = (string *)*in_RDX;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Kd",&local_89);
    syntactic::ParamSet::getParamTexture((ParamSet *)(a_Stack_50 + 2),name);
    findOrCreateTexture((SemanticParser *)local_68,(SP *)in);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)(local_68._16_8_ + 0x60),
               (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  else {
    pPVar1 = (ParamSet *)*in_RDX;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Kd",(allocator<char> *)local_68);
    syntactic::ParamSet::getParam3f(pPVar1,(float *)(uVar2 + 0x50),&local_88);
  }
  std::__cxx11::string::~string((string *)&local_88);
  _Var3._M_pi = a_Stack_50[0]._M_pi;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._16_8_;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  local_68._16_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_translucent(pbrt::syntactic::Material::SP in)
  {
    TranslucentMaterial::SP mat = std::make_shared<TranslucentMaterial>(in->name);

    in->getParam3f(&mat->transmit.x,"transmit");
    in->getParam3f(&mat->reflect.x,"reflect");
    if (in->hasParamTexture("Kd"))
      mat->map_kd = findOrCreateTexture(in->getParamTexture("Kd"));
    else
      in->getParam3f(&mat->kd.x,"Kd");
          
    return mat;
  }